

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O2

void duckdb::JemallocExtension::ThreadFlush(idx_t threshold)

{
  idx_t arena_idx;
  size_t len;
  string purge_arena;
  size_t local_38;
  string local_30;
  
  local_38 = 8;
  duckdb_je_mallctl("thread.peak.read",&local_30,&local_38,(void *)0x0,0);
  if (local_30._M_dataplus._M_p <= threshold) {
    SetJemallocCTL("thread.tcache.flush");
    local_30._M_dataplus._M_p = (char *)0x4;
    duckdb_je_mallctl("thread.arena",&local_38,(size_t *)&local_30,(void *)0x0,0);
    PurgeArenaString_abi_cxx11_(&local_30,(duckdb *)(local_38 & 0xffffffff),arena_idx);
    SetJemallocCTL(local_30._M_dataplus._M_p);
    SetJemallocCTL("thread.peak.reset");
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void JemallocExtension::ThreadFlush(idx_t threshold) {
	// We flush after exceeding the threshold
	if (GetJemallocCTL<uint64_t>("thread.peak.read") > threshold) {
		return;
	}

	// Flush thread-local cache
	SetJemallocCTL("thread.tcache.flush");

	// Flush this thread's arena
	const auto purge_arena = PurgeArenaString(idx_t(GetJemallocCTL<unsigned>("thread.arena")));
	SetJemallocCTL(purge_arena.c_str());

	// Reset the peak after resetting
	SetJemallocCTL("thread.peak.reset");
}